

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O3

void Js::CacheOperators::CachePropertyRead
               (Var startingObject,RecyclableObject *objectWithProperty,bool isRoot,
               PropertyId propertyId,bool isMissing,PropertyValueInfo *info,
               ScriptContext *requestContext)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  code *pcVar5;
  ushort uVar6;
  bool bVar7;
  InlineCacheFlags IVar8;
  PropertyIndex PVar9;
  int iVar10;
  undefined4 *puVar11;
  RootObjectBase *this;
  DynamicObject *objectWithProperty_00;
  RecyclableObject *pRVar12;
  
  bVar7 = CanCachePropertyRead(info,objectWithProperty,requestContext);
  if (!bVar7) {
    return;
  }
  IVar8 = info->flags;
  if ((IVar8 & InlineCacheGetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x1b,"(!(info->GetFlags() & InlineCacheGetterFlag))",
                                "We cache getters only in DictionaryTypeHandler::GetProperty() before they were executed"
                               );
    if (!bVar7) goto LAB_0095a4ad;
    *puVar11 = 0;
    IVar8 = info->flags;
  }
  if ((IVar8 & InlineCacheSetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x1c,"((info->GetFlags() & InlineCacheSetterFlag) == 0)",
                                "invalid setter flag in CachePropertyRead");
    if (!bVar7) goto LAB_0095a4ad;
    *puVar11 = 0;
  }
  if (info->m_instance != objectWithProperty) {
    if ((info->m_instance != (RecyclableObject *)0x0) && (info->m_propertyIndex == 0xffff)) {
      return;
    }
    iVar10 = (*(objectWithProperty->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[9])(objectWithProperty,(ulong)(uint)propertyId);
    if ((short)iVar10 == -1) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x1f,
                                "(info->IsNoCache() || objectWithProperty->GetPropertyIndex(propertyId) == Constants::NoSlot)"
                                ,"Missed updating PropertyValueInfo?");
    if (bVar7) {
      *puVar11 = 0;
      return;
    }
    goto LAB_0095a4ad;
  }
  uVar2 = info->m_propertyIndex;
  iVar10 = (*(objectWithProperty->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[9])(objectWithProperty,(ulong)(uint)propertyId);
  if (uVar2 != (ushort)iVar10) {
    if ((((objectWithProperty->type).ptr)->typeId & ~TypeIds_Null) == TypeIds_GlobalObject) {
      this = VarTo<Js::RootObjectBase,Js::RecyclableObject>(objectWithProperty);
      PVar9 = RootObjectBase::GetRootPropertyIndex(this,propertyId);
      if (uVar2 == PVar9) goto LAB_0095a277;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x26,
                                "(propertyIndex == objectWithProperty->GetPropertyIndex(propertyId) || (VarIs<RootObjectBase>(objectWithProperty) && propertyIndex == VarTo<RootObjectBase>(objectWithProperty)->GetRootPropertyIndex(propertyId)))"
                                ,
                                "propertyIndex == objectWithProperty->GetPropertyIndex(propertyId) || (VarIs<RootObjectBase>(objectWithProperty) && propertyIndex == VarTo<RootObjectBase>(objectWithProperty)->GetRootPropertyIndex(propertyId))"
                               );
    if (!bVar7) goto LAB_0095a4ad;
    *puVar11 = 0;
  }
LAB_0095a277:
  bVar7 = DynamicType::Is(((objectWithProperty->type).ptr)->typeId);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x27,"(DynamicType::Is(objectWithProperty->GetTypeId()))",
                                "DynamicType::Is(objectWithProperty->GetTypeId())");
    if (!bVar7) goto LAB_0095a4ad;
    *puVar11 = 0;
  }
  if ((((info->m_instance == (RecyclableObject *)0x0) || (info->m_propertyIndex != 0xffff)) &&
      (info->m_instance == objectWithProperty)) &&
     (((info->cacheInfoFlag & enableStoreFieldCacheFlag) != 0 &&
      (iVar10 = (*(objectWithProperty->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x23])(objectWithProperty,(ulong)(uint)propertyId),
      iVar10 != 0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x2c,
                                "(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || info->GetInstance() != objectWithProperty || !objectWithProperty->IsFixedProperty(propertyId))"
                                ,
                                "info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || info->GetInstance() != objectWithProperty || !objectWithProperty->IsFixedProperty(propertyId)"
                               );
    if (!bVar7) goto LAB_0095a4ad;
    *puVar11 = 0;
  }
  objectWithProperty_00 = VarTo<Js::DynamicObject,Js::RecyclableObject>(objectWithProperty);
  lVar4 = *(long *)((objectWithProperty_00->super_RecyclableObject).type.ptr + 1);
  uVar3 = *(ushort *)(lVar4 + 0x12);
  uVar6 = -uVar3;
  if (uVar2 < uVar3) {
    uVar6 = *(ushort *)(lVar4 + 10) >> 3;
  }
  if (objectWithProperty == (RecyclableObject *)startingObject) {
    bVar1 = info->m_attributes;
    iVar10 = (*(objectWithProperty->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x30])(objectWithProperty,(ulong)(uint)propertyId);
    if ((iVar10 == 0) == (bool)((bVar1 & 4) >> 2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0x37,
                                  "(info->IsWritable() == (objectWithProperty->IsWritable(propertyId) ? true : false))"
                                  ,
                                  "info->IsWritable() == (objectWithProperty->IsWritable(propertyId) ? true : false)"
                                 );
      if (!bVar7) {
LAB_0095a4ad:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
    }
  }
  else {
    if ((info->cacheInfoFlag & disablePrototypeCacheFlag) != 0) {
      return;
    }
    bVar7 = VarIs<Js::RecyclableObject>(startingObject);
    if (!bVar7) {
      return;
    }
    pRVar12 = UnsafeVarTo<Js::RecyclableObject>(startingObject);
    if ((((((pRVar12->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
        scriptContext.ptr != requestContext) {
      return;
    }
  }
  pRVar12 = VarTo<Js::RecyclableObject>(startingObject);
  Cache<false,true,true>
            (objectWithProperty != (RecyclableObject *)startingObject,objectWithProperty_00,isRoot,
             (pRVar12->type).ptr,(Type *)0x0,propertyId,uVar6 + uVar2,uVar2 < uVar3,isMissing,0,info
             ,requestContext);
  return;
}

Assistant:

void CacheOperators::CachePropertyRead(
        Var startingObject,
        RecyclableObject * objectWithProperty,
        const bool isRoot,
        PropertyId propertyId,
        const bool isMissing,
        PropertyValueInfo* info,
        ScriptContext * requestContext)
    {
        if (!CanCachePropertyRead(info, objectWithProperty, requestContext))
        {
            return;
        }

        AssertMsg(!(info->GetFlags() & InlineCacheGetterFlag), "We cache getters only in DictionaryTypeHandler::GetProperty() before they were executed");
        AssertMsg((info->GetFlags() & InlineCacheSetterFlag) == 0, "invalid setter flag in CachePropertyRead");
        if (info->GetInstance() != objectWithProperty) // We can't cache if slot owner is not the object
        {
            AssertMsg(info->IsNoCache() || objectWithProperty->GetPropertyIndex(propertyId) == Constants::NoSlot, "Missed updating PropertyValueInfo?");
            return;
        }

        PropertyIndex propertyIndex = info->GetPropertyIndex();

        Assert(propertyIndex == objectWithProperty->GetPropertyIndex(propertyId) ||
            (VarIs<RootObjectBase>(objectWithProperty) && propertyIndex == VarTo<RootObjectBase>(objectWithProperty)->GetRootPropertyIndex(propertyId)));
        Assert(DynamicType::Is(objectWithProperty->GetTypeId()));

#if ENABLE_FIXED_FIELDS
        // We are populating a cache guarded by the instance's type (not the type of the object with property somewhere in the prototype chain),
        // so we only care if the instance's property (if any) is fixed.
        Assert(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || info->GetInstance() != objectWithProperty || !objectWithProperty->IsFixedProperty(propertyId));
#endif

        DynamicObject * dynamicObjectWithProperty = VarTo<DynamicObject>(objectWithProperty);
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicObjectWithProperty->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(propertyIndex, &slotIndex, &isInlineSlot);

        const bool isProto = objectWithProperty != startingObject;
        if(!isProto)
        {
            Assert(info->IsWritable() == (objectWithProperty->IsWritable(propertyId) ? true : false));
            // Because StFld and LdFld caches aren't shared, we can safely cache for LdFld operations even if the property isn't writable.
        }
        else if(
            PropertyValueInfo::PrototypeCacheDisabled((PropertyValueInfo*)info) ||
            !VarIs<RecyclableObject>(startingObject) ||
            UnsafeVarTo<RecyclableObject>(startingObject)->GetScriptContext() != requestContext)
        {
            // Don't need to cache if the beginning property is number etc.
            return;
        }

#ifdef TELEMETRY_AddToCache
        // For performance reasons, only execute this code in interpreted mode, not JIT.
        // This method only returns true in interpreted mode and can be used to detect interpreted mode.
        if (info->AllowResizingPolymorphicInlineCache())
        {
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(objectWithProperty, propertyId, nullptr);
            }
        }
#endif

        Cache<false, true, true>(
            isProto,
            dynamicObjectWithProperty,
            isRoot,
            VarTo<RecyclableObject>(startingObject)->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            isMissing,
            0,
            info,
            requestContext);
    }